

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O2

Fl_Menu_Item * __thiscall
Fl_Menu_Item::pulldown
          (Fl_Menu_Item *this,int X,int Y,int W,int H,Fl_Menu_Item *initial_item,Fl_Menu_ *pbutton,
          Fl_Menu_Item *t,int menubar)

{
  int iVar1;
  int iVar2;
  menutitle *pmVar3;
  int X_00;
  Fl_Window *pFVar4;
  menuwindow *pmVar5;
  long lVar6;
  menuwindow *this_00;
  ulong uVar7;
  int Y_00;
  int iVar8;
  int iVar9;
  int iVar10;
  menuwindow *pmVar11;
  int iVar12;
  int iVar13;
  Fl_Menu_Item *pFVar14;
  Fl_Menu_Item *pFVar15;
  int iVar16;
  long lVar17;
  int in_stack_fffffffffffffd98;
  Fl_Menu_Item *local_248;
  int waY;
  int waX;
  menustate pp;
  int waH;
  int waW;
  menuwindow mw;
  
  Fl_Group::current((Fl_Group *)0x0);
  button = pbutton;
  if ((pbutton == (Fl_Menu_ *)0x0) ||
     (pFVar4 = Fl_Widget::window(&pbutton->super_Fl_Widget), pFVar4 == (Fl_Window *)0x0)) {
    X = (X + Fl::e_x_root) - Fl::e_x;
    Y = (Y + Fl::e_y_root) - Fl::e_y;
  }
  else {
    while (pbutton = (Fl_Menu_ *)Fl_Widget::window(&pbutton->super_Fl_Widget),
          (Fl_Window *)pbutton != (Fl_Window *)0x0) {
      X = X + (((Fl_Window *)pbutton)->super_Fl_Group).super_Fl_Widget.x_;
      Y = Y + (((Fl_Window *)pbutton)->super_Fl_Group).super_Fl_Widget.y_;
    }
  }
  menuwindow::menuwindow(&mw,this,X,Y,W,H,initial_item,t,menubar,0,in_stack_fffffffffffffd98);
  pmVar11 = &mw;
  Fl::grab((Fl_Window *)&mw);
  ::p = &pp;
  pp.p[0] = &mw;
  pp.nummenus = 1;
  pp.menubar = menubar;
  pp.state = 0;
  pp.fakemenu = (menuwindow *)0x0;
  if (mw.selected < 0 || initial_item == (Fl_Menu_Item *)0x0) {
    pp.current_item = (Fl_Menu_Item *)0x0;
    pp.menu_number = 0;
    pp.item_number = -1;
    if (menubar == 0) goto LAB_001afd4e;
    pmVar11 = &mw;
    iVar8 = menuwindow::handle(pmVar11,5);
    if (iVar8 == 0) {
      pFVar15 = (Fl_Menu_Item *)0x0;
      Fl::grab((Fl_Window *)0x0);
LAB_001b0292:
      menuwindow::~menuwindow(&mw);
      return pFVar15;
    }
    local_248 = pp.current_item;
    if (pp.current_item == (Fl_Menu_Item *)0x0) goto LAB_001afd4e;
  }
  else {
    setitem(0,mw.selected);
    local_248 = initial_item;
  }
LAB_001afe4d:
  do {
    pFVar15 = pp.current_item;
    pmVar5 = pp.p[pp.menu_number];
    if (((pp.current_item)->flags & 0x11) == 0) {
      pmVar11 = pmVar5;
      menuwindow::set_selected(pmVar5,pp.item_number);
      if (pFVar15 == local_248) {
        local_248 = (Fl_Menu_Item *)0x0;
      }
      if ((pFVar15->flags & 0x60U) == 0) {
        while( true ) {
          lVar6 = (long)pp.nummenus;
          if (pp.nummenus <= pp.menu_number + 1) break;
          pp.nummenus = pp.nummenus + -1;
          pmVar11 = pp.p[lVar6 + -1];
          if (pmVar11 != (menuwindow *)0x0) {
            (*(pmVar11->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
              super_Fl_Widget._vptr_Fl_Widget[1])();
          }
        }
        if ((pp.menu_number == 0) && (pp.menubar != 0)) {
          this_00 = (menuwindow *)operator_new(0x118);
          iVar8 = (pmVar5->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                  super_Fl_Group.super_Fl_Widget.x_;
          iVar9 = menuwindow::titlex(pmVar5,pp.item_number);
          menuwindow::menuwindow
                    (this_00,(Fl_Menu_Item *)0x0,iVar9 + iVar8,
                     (pmVar5->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                     super_Fl_Group.super_Fl_Widget.h_ +
                     (pmVar5->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                     super_Fl_Group.super_Fl_Widget.y_,0,0,(Fl_Menu_Item *)0x0,pFVar15,0,1,
                     in_stack_fffffffffffffd98);
          pmVar11 = (menuwindow *)this_00->title;
          pp.fakemenu = this_00;
          (*(pmVar11->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
            super_Fl_Widget._vptr_Fl_Widget[5])();
        }
      }
      else {
        if ((pFVar15->flags & 0x40U) == 0) {
          pFVar14 = (Fl_Menu_Item *)pFVar15->user_data_;
        }
        else {
          pFVar14 = pFVar15 + 1;
        }
        iVar8 = (pmVar5->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group
                .super_Fl_Widget.x_;
        if ((pp.menu_number == 0) && (pp.menubar != 0)) {
          iVar9 = menuwindow::titlex(pmVar5,pp.item_number);
          iVar8 = iVar8 + iVar9;
          iVar9 = (pmVar5->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                  super_Fl_Group.super_Fl_Widget.h_ +
                  (pmVar5->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                  super_Fl_Group.super_Fl_Widget.y_;
LAB_001b010b:
          iVar12 = pp.menu_number;
          if ((pp.menu_number + 1 < pp.nummenus) && (pp.p[pp.menu_number + 1]->menu == pFVar14)) {
            do {
              do {
                iVar8 = pp.nummenus + -1;
                if (pp.nummenus <= iVar12 + 2) {
                  pmVar11 = pp.p[iVar8];
                  menuwindow::set_selected(pmVar11,-1);
                  goto LAB_001afd4e;
                }
                pp.nummenus = iVar8;
              } while (pp.p[iVar8] == (menuwindow *)0x0);
              (*(pp.p[iVar8]->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[1])();
              iVar12 = pp.menu_number;
            } while( true );
          }
          do {
            do {
              if (pp.nummenus <= iVar12 + 1) {
                pmVar5 = (menuwindow *)operator_new(0x118);
                pmVar11 = pmVar5;
                menuwindow::menuwindow
                          (pmVar5,pFVar14,iVar8,iVar9,(uint)(pFVar15 != (Fl_Menu_Item *)0x0),0,
                           (Fl_Menu_Item *)0x0,pFVar15,0,menubar,in_stack_fffffffffffffd98);
                lVar6 = (long)pp.nummenus;
                pp.nummenus = pp.nummenus + 1;
                pp.p[lVar6] = pmVar5;
                goto LAB_001afd4e;
              }
              pp.nummenus = pp.nummenus + -1;
            } while (pp.p[pp.nummenus] == (menuwindow *)0x0);
            (*(pp.p[pp.nummenus]->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
              super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[1])();
            iVar12 = pp.menu_number;
          } while( true );
        }
        iVar8 = iVar8 + (pmVar5->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                        super_Fl_Group.super_Fl_Widget.w_;
        iVar9 = pmVar5->itemheight * pp.item_number +
                (pmVar5->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group
                .super_Fl_Widget.y_;
        if (local_248 == (Fl_Menu_Item *)0x0) {
          pFVar15 = (Fl_Menu_Item *)0x0;
          goto LAB_001b010b;
        }
        pmVar5 = (menuwindow *)operator_new(0x118);
        pmVar11 = pmVar5;
        menuwindow::menuwindow
                  (pmVar5,pFVar14,X,Y,W,H,local_248,(Fl_Menu_Item *)0x0,0,0,
                   in_stack_fffffffffffffd98);
        lVar6 = (long)pp.nummenus;
        pp.nummenus = pp.nummenus + 1;
        pp.p[lVar6] = pmVar5;
        if (-1 < pmVar5->selected) {
          iVar12 = (pmVar5->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                   super_Fl_Group.super_Fl_Widget.x_;
          iVar16 = (pmVar5->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                   super_Fl_Group.super_Fl_Widget.y_;
          Fl::screen_work_area(&waX,&waY,&waW,&waH,X,Y);
          iVar12 = iVar12 - iVar8;
          iVar16 = iVar16 - iVar9;
          for (lVar6 = 0; iVar9 = waX, iVar8 = waY, lVar6 <= pp.menu_number; lVar6 = lVar6 + 1) {
            pmVar11 = pp.p[lVar6];
            iVar1 = (pmVar11->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                    super_Fl_Group.super_Fl_Widget.x_;
            iVar2 = (pmVar11->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                    super_Fl_Group.super_Fl_Widget.y_;
            iVar10 = iVar1 + iVar12;
            X_00 = waX;
            if (waX < iVar10) {
              X_00 = iVar10;
            }
            iVar13 = iVar2 + iVar16;
            Y_00 = waY;
            if (waY < iVar13) {
              Y_00 = iVar13;
            }
            menuwindow::position(pmVar11,X_00,Y_00);
            if (iVar13 < iVar8) {
              iVar16 = iVar8 - iVar2;
            }
            if (iVar10 < iVar9) {
              iVar12 = iVar9 - iVar1;
            }
          }
          setitem(pp.nummenus + -1,pmVar5->selected);
          goto LAB_001afe4d;
        }
      }
    }
    else {
      menuwindow::set_selected(pmVar5,-1);
      pmVar11 = pmVar5;
    }
LAB_001afd4e:
    lVar17 = (long)menubar;
    lVar6 = lVar17;
    while( true ) {
      while( true ) {
        for (; pFVar14 = pp.current_item, lVar6 < pp.nummenus; lVar6 = lVar6 + 1) {
          pmVar11 = pp.p[lVar6];
          if ((pmVar11->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.i ==
              (Fl_X *)0x0) {
            pmVar3 = pmVar11->title;
            if (pmVar3 != (menutitle *)0x0) {
              (*(pmVar3->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group
                .super_Fl_Widget._vptr_Fl_Widget[5])(pmVar3);
              pmVar11 = pp.p[lVar6];
            }
            (*(pmVar11->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
              super_Fl_Widget._vptr_Fl_Widget[5])();
          }
        }
        Fl::wait(pmVar11);
        pFVar15 = pp.current_item;
        iVar8 = 0;
        if (pp.current_item == pFVar14) {
          iVar8 = 7;
        }
        if (pp.state == 2) {
          iVar8 = 6;
        }
        if (iVar8 == 0) break;
        lVar6 = lVar17;
        if (iVar8 != 7) {
          pmVar11 = pp.fakemenu;
          if (pp.fakemenu != (menuwindow *)0x0) goto LAB_001b0257;
          goto LAB_001b025d;
        }
      }
      if (pp.fakemenu != (menuwindow *)0x0) {
        (*((pp.fakemenu)->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
          super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[1])();
        pp.fakemenu = (menuwindow *)0x0;
      }
      if (pp.current_item != (Fl_Menu_Item *)0x0) break;
      pmVar11 = pp.p[(long)pp.nummenus + -1];
      menuwindow::set_selected(pmVar11,-1);
      lVar6 = lVar17;
    }
    local_248 = (Fl_Menu_Item *)0x0;
    menuwindow::autoscroll(pp.p[pp.menu_number],pp.item_number);
  } while( true );
LAB_001b025d:
  uVar7 = (ulong)(uint)pp.nummenus;
  do {
    if ((int)uVar7 < 2) {
      Fl_Menu_Window::hide(&mw.super_Fl_Menu_Window);
      Fl::grab((Fl_Window *)0x0);
      goto LAB_001b0292;
    }
    pp.nummenus = (int)uVar7 - 1;
    uVar7 = (ulong)(uint)pp.nummenus;
    pmVar11 = pp.p[uVar7];
  } while (pmVar11 == (menuwindow *)0x0);
LAB_001b0257:
  (*(pmVar11->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
    super_Fl_Widget._vptr_Fl_Widget[1])();
  goto LAB_001b025d;
}

Assistant:

const Fl_Menu_Item* Fl_Menu_Item::pulldown(
    int X, int Y, int W, int H,
    const Fl_Menu_Item* initial_item,
    const Fl_Menu_* pbutton,
    const Fl_Menu_Item* t,
    int menubar) const {
  Fl_Group::current(0); // fix possible user error...

  button = pbutton;
  if (pbutton && pbutton->window()) {
    for (Fl_Window* w = pbutton->window(); w; w = w->window()) {
      X += w->x();
      Y += w->y();
    }
  } else {
    X += Fl::event_x_root()-Fl::event_x();
    Y += Fl::event_y_root()-Fl::event_y();
  }
  menuwindow mw(this, X, Y, W, H, initial_item, t, menubar);
  Fl::grab(mw);
  menustate pp; p = &pp;
  pp.p[0] = &mw;
  pp.nummenus = 1;
  pp.menubar = menubar;
  pp.state = INITIAL_STATE;
  pp.fakemenu = 0; // kludge for buttons in menubar

  // preselected item, pop up submenus if necessary:
  if (initial_item && mw.selected >= 0) {
    setitem(0, mw.selected);
    goto STARTUP;
  }

  pp.current_item = 0; pp.menu_number = 0; pp.item_number = -1;
  if (menubar) {
    // find the initial menu
    if (!mw.handle(FL_DRAG)) {
      Fl::grab(0);
      return 0;
    }
  }
  initial_item = pp.current_item;
  if (initial_item) goto STARTUP;

  // the main loop, runs until p.state goes to DONE_STATE:
  for (;;) {

    // make sure all the menus are shown:
    {
      for (int k = menubar; k < pp.nummenus; k++) {
        if (!pp.p[k]->shown()) {
	  if (pp.p[k]->title) pp.p[k]->title->show();
	  pp.p[k]->show();
        }
      }
    }

    // get events:
    {
      const Fl_Menu_Item* oldi = pp.current_item;
      Fl::wait();
      if (pp.state == DONE_STATE) break; // done.
      if (pp.current_item == oldi) continue;
    }

    // only do rest if item changes:
    if(pp.fakemenu) {delete pp.fakemenu; pp.fakemenu = 0;} // turn off "menubar button"

    if (!pp.current_item) { // pointing at nothing
      // turn off selection in deepest menu, but don't erase other menus:
      pp.p[pp.nummenus-1]->set_selected(-1);
      continue;
    }

    if(pp.fakemenu) {delete pp.fakemenu; pp.fakemenu = 0;}
    initial_item = 0; // stop the startup code
    pp.p[pp.menu_number]->autoscroll(pp.item_number);

  STARTUP:
    menuwindow& cw = *pp.p[pp.menu_number];
    const Fl_Menu_Item* m = pp.current_item;
    if (!m->activevisible()) { // pointing at inactive item
      cw.set_selected(-1);
      initial_item = 0; // turn off startup code
      continue;
    }
    cw.set_selected(pp.item_number);

    if (m==initial_item) initial_item=0; // stop the startup code if item found
    if (m->submenu()) {
      const Fl_Menu_Item* title = m;
      const Fl_Menu_Item* menutable;
      if (m->flags&FL_SUBMENU) menutable = m+1;
      else menutable = (Fl_Menu_Item*)(m)->user_data_;
      // figure out where new menu goes:
      int nX, nY;
      if (!pp.menu_number && pp.menubar) {	// menu off a menubar:
	nX = cw.x() + cw.titlex(pp.item_number);
	nY = cw.y() + cw.h();
	initial_item = 0;
      } else {
	nX = cw.x() + cw.w();
	nY = cw.y() + pp.item_number * cw.itemheight;
	title = 0;
      }
      if (initial_item) { // bring up submenu containing initial item:
	menuwindow* n = new menuwindow(menutable,X,Y,W,H,initial_item,title,0,0,cw.x());
	pp.p[pp.nummenus++] = n;
	// move all earlier menus to line up with this new one:
	if (n->selected>=0) {
	  int dy = n->y()-nY;
	  int dx = n->x()-nX;
	  int waX, waY, waW, waH;
	  Fl::screen_work_area(waX, waY, waW, waH, X, Y);
	  for (int menu = 0; menu <= pp.menu_number; menu++) {
	    menuwindow* tt = pp.p[menu];
	    int nx = tt->x()+dx; if (nx < waX) {nx = waX; dx = -tt->x() + waX;}
	    int ny = tt->y()+dy; if (ny < waY) {ny = waY; dy = -tt->y() + waY;}
	    tt->position(nx, ny);
	  }
	  setitem(pp.nummenus-1, n->selected);
	  goto STARTUP;
	}
      } else if (pp.nummenus > pp.menu_number+1 &&
		 pp.p[pp.menu_number+1]->menu == menutable) {
	// the menu is already up:
	while (pp.nummenus > pp.menu_number+2) delete pp.p[--pp.nummenus];
	pp.p[pp.nummenus-1]->set_selected(-1);
      } else {
	// delete all the old menus and create new one:
	while (pp.nummenus > pp.menu_number+1) delete pp.p[--pp.nummenus];
	pp.p[pp.nummenus++]= new menuwindow(menutable, nX, nY,
					  title?1:0, 0, 0, title, 0, menubar, 
					    (title ? 0 : cw.x()) );
      }
    } else { // !m->submenu():
      while (pp.nummenus > pp.menu_number+1) delete pp.p[--pp.nummenus];
      if (!pp.menu_number && pp.menubar) {
	// kludge so "menubar buttons" turn "on" by using menu title:
	pp.fakemenu = new menuwindow(0,
				  cw.x()+cw.titlex(pp.item_number),
				  cw.y()+cw.h(), 0, 0,
				  0, m, 0, 1);
	pp.fakemenu->title->show();
      }
    }
  }
  const Fl_Menu_Item* m = pp.current_item;
  delete pp.fakemenu;
  while (pp.nummenus>1) delete pp.p[--pp.nummenus];
  mw.hide();
  Fl::grab(0);
  return m;
}